

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall TestTransaction::TestTransaction(TestTransaction *this)

{
  int iVar1;
  CfdException *this_00;
  allocator local_49;
  wally_tx *tx_pointer;
  string local_40;
  
  cfd::core::AbstractTransaction::AbstractTransaction(&this->super_AbstractTransaction);
  (this->super_AbstractTransaction)._vptr_AbstractTransaction =
       (_func_int **)&PTR__AbstractTransaction_005bad80;
  tx_pointer = (wally_tx *)0x0;
  iVar1 = wally_tx_init_alloc(2,0,0,0,&tx_pointer);
  if (iVar1 == 0) {
    (this->super_AbstractTransaction).wally_tx_pointer_ = tx_pointer;
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_40,"transaction data generate error.",&local_49);
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

TestTransaction() {
    struct wally_tx *tx_pointer = NULL;
    int ret = wally_tx_init_alloc(2, 0, 0, 0, &tx_pointer);
    if (ret != WALLY_OK) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "transaction data generate error.");
    }
    wally_tx_pointer_ = tx_pointer;
  }